

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O0

void __thiscall
AssertionTest_assertLeHandlerShouldNotBeCalled_Test::
~AssertionTest_assertLeHandlerShouldNotBeCalled_Test
          (AssertionTest_assertLeHandlerShouldNotBeCalled_Test *this)

{
  AssertionTest_assertLeHandlerShouldNotBeCalled_Test *this_local;
  
  AssertionTest::~AssertionTest(&this->super_AssertionTest);
  return;
}

Assistant:

TEST_F(AssertionTest, assertLeHandlerShouldNotBeCalled)
{
    std::int32_t a = 1;
    std::int32_t b = 1;
    CPP_ASSERT_LE(a, b);
    EXPECT_EQ(0, assertionHandlerCounter_);
    a = 0;
    CPP_ASSERT_LE(a, b);
    EXPECT_EQ(0, assertionHandlerCounter_);

    SET_EXPECTED_MSG(a, b);
    CPP_ASSERT_LE(a, b, EXPECTED_TEST_MSG(a,b));
    EXPECT_EQ(0, assertionHandlerCounter_);
}